

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::core::ConfidentialTransaction::CheckTxInIndex
          (ConfidentialTransaction *this,uint32_t index,int line,char *caller)

{
  size_type sVar1;
  char *pcVar2;
  undefined8 uVar3;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff94;
  CfdError in_stack_ffffffffffffff9c;
  CfdException *in_stack_ffffffffffffffa0;
  string local_58 [32];
  undefined1 local_38 [8];
  CfdSourceLocation location;
  char *caller_local;
  int line_local;
  uint32_t index_local;
  ConfidentialTransaction *this_local;
  
  location.funcname = caller;
  caller_local._0_4_ = line;
  caller_local._4_4_ = index;
  _line_local = this;
  sVar1 = ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::
          size(&this->vin_);
  if (sVar1 <= caller_local._4_4_) {
    pcVar2 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                     ,0x2f);
    local_38 = (undefined1  [8])(pcVar2 + 1);
    location.filename._0_4_ = (int)caller_local;
    location._8_8_ = location.funcname;
    logger::warn<unsigned_int&>
              ((CfdSourceLocation *)local_38,"vin[{}] out_of_range.",
               (uint *)((long)&caller_local + 4));
    uVar4 = CONCAT13(1,(int3)in_stack_ffffffffffffff90);
    uVar3 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_58,"vin out_of_range error.",(allocator *)&stack0xffffffffffffffa7);
    CfdException::CfdException
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
               (string *)CONCAT44(in_stack_ffffffffffffff94,uVar4));
    __cxa_throw(uVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return;
}

Assistant:

void ConfidentialTransaction::CheckTxInIndex(
    uint32_t index, int line, const char *caller) const {
  if (vin_.size() <= index) {
    cfd::core::logger::CfdSourceLocation location = {
        CFD_LOG_FILE, line, caller};
    warn(location, "vin[{}] out_of_range.", index);
    throw CfdException(kCfdOutOfRangeError, "vin out_of_range error.");
  }
}